

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Asset.h
# Opt level: O2

void __thiscall glTF2::Asset::SetAsBinary(Asset *this)

{
  Ref<glTF2::Buffer> RVar1;
  
  if ((this->mBodyBuffer).vector != (vector<glTF2::Buffer_*,_std::allocator<glTF2::Buffer_*>_> *)0x0
     ) {
    return;
  }
  RVar1 = LazyDict<glTF2::Buffer>::Create(&this->buffers,"binary_glTF");
  (this->mBodyBuffer).vector = RVar1.vector;
  (this->mBodyBuffer).index = RVar1.index;
  ((RVar1.vector)->super__Vector_base<glTF2::Buffer_*,_std::allocator<glTF2::Buffer_*>_>)._M_impl.
  super__Vector_impl_data._M_start[RVar1.index]->mIsSpecial = true;
  return;
}

Assistant:

T* operator->()
            { return (*vector)[index]; }